

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::DataPageHeaderV2::DataPageHeaderV2(DataPageHeaderV2 *this)

{
  *(undefined ***)this = &PTR__DataPageHeaderV2_019d7258;
  this->num_values = 0;
  this->num_nulls = 0;
  this->num_rows = 0;
  this->encoding = PLAIN;
  this->definition_levels_byte_length = 0;
  this->repetition_levels_byte_length = 0;
  this->is_compressed = true;
  *(undefined ***)&this->statistics = &PTR__Statistics_019d6898;
  (this->statistics).max._M_dataplus._M_p = (pointer)&(this->statistics).max.field_2;
  (this->statistics).max._M_string_length = 0;
  (this->statistics).max.field_2._M_local_buf[0] = '\0';
  (this->statistics).min._M_dataplus._M_p = (pointer)&(this->statistics).min.field_2;
  (this->statistics).min._M_string_length = 0;
  (this->statistics).min.field_2._M_local_buf[0] = '\0';
  (this->statistics).null_count = 0;
  (this->statistics).distinct_count = 0;
  (this->statistics).max_value._M_dataplus._M_p = (pointer)&(this->statistics).max_value.field_2;
  (this->statistics).max_value._M_string_length = 0;
  (this->statistics).max_value.field_2._M_local_buf[0] = '\0';
  (this->statistics).min_value._M_dataplus._M_p = (pointer)&(this->statistics).min_value.field_2;
  (this->statistics).min_value._M_string_length = 0;
  (this->statistics).min_value.field_2._M_local_buf[0] = '\0';
  (this->statistics).is_max_value_exact = false;
  (this->statistics).is_min_value_exact = false;
  (this->statistics).__isset = (_Statistics__isset)0x0;
  this->__isset = (_DataPageHeaderV2__isset)(((byte)this->__isset & 0xfc) + 1);
  return;
}

Assistant:

DataPageHeaderV2::DataPageHeaderV2() noexcept
   : num_values(0),
     num_nulls(0),
     num_rows(0),
     encoding(static_cast<Encoding::type>(0)),
     definition_levels_byte_length(0),
     repetition_levels_byte_length(0),
     is_compressed(true) {
}